

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

Abc_Obj_t * Abc_NtkFindCo(Abc_Ntk_t *pNtk,char *pName)

{
  int i;
  Abc_Obj_t *pAVar1;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x234,"Abc_Obj_t *Abc_NtkFindCo(Abc_Ntk_t *, char *)");
  }
  i = Nm_ManFindIdByName(pNtk->pManName,pName,3);
  if (i < 0) {
    i = Nm_ManFindIdByName(pNtk->pManName,pName,4);
    if (i < 0) {
      return (Abc_Obj_t *)0x0;
    }
  }
  pAVar1 = Abc_NtkObj(pNtk,i);
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_NtkFindCo( Abc_Ntk_t * pNtk, char * pName )
{
    int Num;
    assert( !Abc_NtkIsNetlist(pNtk) );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_PO );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BI );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    return NULL;
}